

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_mac_init(EVP_PKEY_CTX *ctx)

{
  void *__s;
  EVP_PKEY *pkey_00;
  undefined4 *puVar1;
  EVP_PKEY_CTX *in_RDI;
  gost_mac_key *key;
  EVP_PKEY *pkey;
  gost_mac_pmeth_data *data;
  int local_4;
  
  __s = CRYPTO_malloc(0x30,
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                      ,0x23e);
  pkey_00 = EVP_PKEY_CTX_get0_pkey(in_RDI);
  if (__s == (void *)0x0) {
    local_4 = 0;
  }
  else {
    memset(__s,0,0x30);
    *(undefined2 *)((long)__s + 2) = 4;
    *(undefined4 *)((long)__s + 4) = 0;
    if ((pkey_00 != (EVP_PKEY *)0x0) &&
       (puVar1 = (undefined4 *)EVP_PKEY_get0(pkey_00), puVar1 != (undefined4 *)0x0)) {
      *(undefined4 *)((long)__s + 4) = *puVar1;
      *(undefined2 *)((long)__s + 2) = *(undefined2 *)(puVar1 + 9);
    }
    EVP_PKEY_CTX_set_data(in_RDI,__s);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int pkey_gost_mac_init(EVP_PKEY_CTX *ctx)
{
    struct gost_mac_pmeth_data *data = OPENSSL_malloc(sizeof(*data));
    EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx);

    if (!data)
        return 0;
    memset(data, 0, sizeof(*data));
    data->mac_size = 4;
    data->mac_param_nid = NID_undef;

    if (pkey) {
        struct gost_mac_key *key = EVP_PKEY_get0(pkey);
        if (key) {
            data->mac_param_nid = key->mac_param_nid;
            data->mac_size = key->mac_size;
        }
    }

    EVP_PKEY_CTX_set_data(ctx, data);
    return 1;
}